

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O0

double Jupiter_strtod_nospace_s(char *str,size_t length)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  double dVar4;
  int local_3c;
  double dStack_38;
  int tval;
  double decimal;
  double total;
  size_t sStack_20;
  int base;
  size_t length_local;
  char *str_local;
  
  decimal = 0.0;
  dStack_38 = 0.0;
  if (length == 0) {
    str_local = (char *)0x0;
  }
  else if (*str == '-') {
    dVar4 = Jupiter_strtod_nospace_s(str + 1,length - 1);
    str_local = (char *)(dVar4 * -1.0);
  }
  else {
    sStack_20 = length;
    length_local = (size_t)str;
    if (*str == '+') {
      length_local = (size_t)(str + 1);
      sStack_20 = length - 1;
    }
    while (iVar3 = Jupiter_getBase(*(uchar *)length_local,10), iVar3 != -1) {
      decimal = decimal * 10.0 + (double)iVar3;
      sStack_20 = sStack_20 - 1;
      if (sStack_20 == 0) {
        return decimal;
      }
      length_local = length_local + 1;
    }
    if (*(char *)length_local == '.') {
      sStack_20 = sStack_20 - 1;
      local_3c = 10;
      sVar2 = length_local;
      while( true ) {
        length_local = sVar2 + 1;
        bVar1 = false;
        if (sStack_20 != 0) {
          iVar3 = Jupiter_getBase(*(uchar *)length_local,10);
          dStack_38 = (double)iVar3;
          bVar1 = dStack_38 != -1.0;
        }
        if (!bVar1) {
          if ((*(char *)length_local == 'e') || (*(char *)length_local == 'E')) {
            iVar3 = Jupiter_strtoi_nospace_s((char *)(sVar2 + 2),sStack_20 - 1,10);
            dVar4 = pow(10.0,(double)iVar3);
            decimal = decimal * dVar4;
          }
          goto LAB_0019510c;
        }
        decimal = decimal + dStack_38 / (double)local_3c;
        sStack_20 = sStack_20 + -1;
        str_local = (char *)decimal;
        if (sStack_20 == 0) break;
        local_3c = local_3c * 10;
        sVar2 = length_local;
      }
    }
    else {
LAB_0019510c:
      str_local = (char *)decimal;
    }
  }
  return (double)str_local;
}

Assistant:

double Jupiter_strtod_nospace_s(const char *str, size_t length)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (length == 0)
		return 0;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace_s(++str, --length);

	if (*str == '+')
		++str, --length;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		if (--length == 0)
			return total;
		++str;
	}

	if (*str == '.')
	{
		++str;
		--length;

		tval = base;
		while (length != 0 && (decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			if (--length == 0)
				return total;
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace_s(++str, --length, 10));
	}

	return total;
}